

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_1::UniformCollection::moveContents
          (UniformCollection *this,UniformCollection *receiver)

{
  size_type sVar1;
  reference uniform;
  reference ppSVar2;
  int local_20;
  int local_1c;
  int i_1;
  int i;
  UniformCollection *receiver_local;
  UniformCollection *this_local;
  
  local_1c = 0;
  while( true ) {
    sVar1 = std::
            vector<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
            ::size(&this->m_uniforms);
    if ((int)sVar1 <= local_1c) break;
    uniform = std::
              vector<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
              ::operator[](&this->m_uniforms,(long)local_1c);
    addUniform(receiver,uniform);
    local_1c = local_1c + 1;
  }
  std::
  vector<deqp::gles3::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::Uniform>_>
  ::clear(&this->m_uniforms);
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>::size
                      (&this->m_structTypes);
    if ((int)sVar1 <= local_20) break;
    ppSVar2 = std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>::
              operator[](&this->m_structTypes,(long)local_20);
    addStructType(receiver,*ppSVar2);
    local_20 = local_20 + 1;
  }
  std::vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>::clear
            (&this->m_structTypes);
  return;
}

Assistant:

void moveContents (UniformCollection& receiver)
	{
		for (int i = 0; i < (int)m_uniforms.size(); i++)
			receiver.addUniform(m_uniforms[i]);
		m_uniforms.clear();

		for (int i = 0; i < (int)m_structTypes.size(); i++)
			receiver.addStructType(m_structTypes[i]);
		m_structTypes.clear();
	}